

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O0

void __thiscall PGSStreamReader::yuvToRgb(PGSStreamReader *this,int minY)

{
  uint8_t uVar1;
  YUVQuad YVar2;
  RGBQUAD RVar3;
  bool bVar4;
  reference ppVar5;
  byte *pbVar6;
  YUVQuad *local_868;
  undefined4 local_85d;
  YUVQuad local_859;
  RGBQUAD zeroRgb;
  const_iterator cStack_850;
  pair<const_unsigned_char,_text_subtitles::YUVQuad> itr;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_char,_text_subtitles::YUVQuad,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_text_subtitles::YUVQuad>_>_>
  *__range1;
  YUVQuad yuvPal [256];
  RGBQUAD rgbPal [256];
  RGBQUAD *dst;
  uint8_t *end;
  byte *pbStack_20;
  int size;
  uint8_t *src;
  int minY_local;
  PGSStreamReader *this_local;
  
  pbStack_20 = this->m_imgBuffer;
  pbVar6 = pbStack_20 + (int)((uint)this->m_video_width * (uint)this->m_video_height);
  rgbPal._1016_8_ = this->m_rgbBuffer;
  memset(yuvPal + 0xfe,0,0x400);
  local_868 = (YUVQuad *)&__range1;
  do {
    text_subtitles::YUVQuad::YUVQuad(local_868);
    local_868 = local_868 + 1;
  } while (local_868 != yuvPal + 0xfe);
  memset(yuvPal + 0xfe,0,0x400);
  memset(yuvPal + 0xfe,0,0x400);
  __end1 = std::
           map<unsigned_char,_text_subtitles::YUVQuad,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_text_subtitles::YUVQuad>_>_>
           ::begin(&this->m_palette);
  cStack_850 = std::
               map<unsigned_char,_text_subtitles::YUVQuad,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_text_subtitles::YUVQuad>_>_>
               ::end(&this->m_palette);
  while( true ) {
    bVar4 = std::operator!=(&__end1,&stack0xfffffffffffff7b0);
    if (!bVar4) break;
    ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_char,_text_subtitles::YUVQuad>_>
             ::operator*(&__end1);
    zeroRgb.rgbBlue = ppVar5->first;
    zeroRgb.rgbGreen = (ppVar5->second).Y;
    zeroRgb.rgbRed = (ppVar5->second).Cr;
    zeroRgb.rgbReserved = (ppVar5->second).Cb;
    uVar1 = (ppVar5->second).alpha;
    local_859 = (YUVQuad)text_subtitles::TextToPGSConverter::YUVAToRGBA
                                   ((YUVQuad *)&zeroRgb.rgbGreen);
    RVar3 = zeroRgb;
    yuvPal[(ulong)zeroRgb.rgbBlue + 0xfe] = local_859;
    YVar2.alpha = uVar1;
    YVar2.Y = zeroRgb.rgbGreen;
    YVar2.Cr = zeroRgb.rgbRed;
    YVar2.Cb = zeroRgb.rgbReserved;
    yuvPal[(ulong)zeroRgb.rgbBlue - 2] = YVar2;
    zeroRgb = RVar3;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_char,_text_subtitles::YUVQuad>_>::
    operator++(&__end1);
  }
  memset(&local_85d,0,4);
  for (; pbStack_20 < pbVar6; pbStack_20 = pbStack_20 + 1) {
    if ((int)(uint)yuvPal[(ulong)*pbStack_20 - 2].Y < minY) {
      *(undefined4 *)rgbPal._1016_8_ = local_85d;
    }
    else {
      *(YUVQuad *)rgbPal._1016_8_ = yuvPal[(ulong)*pbStack_20 + 0xfe];
    }
    rgbPal._1016_8_ = rgbPal._1016_8_ + 4;
  }
  return;
}

Assistant:

void PGSStreamReader::yuvToRgb(const int minY) const
{
    const uint8_t* src = m_imgBuffer;
    const int size = m_video_width * m_video_height;
    const uint8_t* end = src + size;
    auto dst = reinterpret_cast<RGBQUAD*>(m_rgbBuffer);

    RGBQUAD rgbPal[256]{};
    YUVQuad yuvPal[256];
    memset(&rgbPal[0], 0, sizeof(rgbPal));
    memset(&rgbPal[0], 0, sizeof(yuvPal));

    for (auto itr : m_palette)
    {
        rgbPal[itr.first] = TextToPGSConverter::YUVAToRGBA(itr.second);
        yuvPal[itr.first] = itr.second;
    }
    constexpr RGBQUAD zeroRgb = {};
    for (; src < end; ++src)
    {
        if (yuvPal[*src].Y >= minY)
            *dst++ = rgbPal[*src];
        else
            *dst++ = zeroRgb;
    }
}